

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,char *name)

{
  bool bVar1;
  pointer this_00;
  char *pcVar2;
  allocator local_61;
  undefined1 local_60 [8];
  string sgName;
  __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
  local_38;
  const_iterator end;
  __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
  local_28;
  const_iterator iter;
  char *name_local;
  cmSourceGroup *this_local;
  
  iter._M_current = (cmSourceGroup *)name;
  end._M_current =
       (cmSourceGroup *)
       std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin
                 (&this->Internal->GroupChildren);
  __gnu_cxx::
  __normal_iterator<cmSourceGroup_const*,std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>>::
  __normal_iterator<cmSourceGroup*>
            ((__normal_iterator<cmSourceGroup_const*,std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>>
              *)&local_28,
             (__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
              *)&end);
  sgName.field_2._8_8_ =
       std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end
                 (&this->Internal->GroupChildren);
  __gnu_cxx::
  __normal_iterator<cmSourceGroup_const*,std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>>::
  __normal_iterator<cmSourceGroup*>
            ((__normal_iterator<cmSourceGroup_const*,std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>>
              *)&local_38,
             (__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
              *)((long)&sgName.field_2 + 8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      return (cmSourceGroup *)0x0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
              ::operator->(&local_28);
    pcVar2 = GetName(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_60,pcVar2,&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,(char *)iter._M_current);
    if (bVar1) {
      this_local = __gnu_cxx::
                   __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                   ::operator*(&local_28);
    }
    std::__cxx11::string::~string((string *)local_60);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
    ::operator++(&local_28);
  }
  return this_local;
}

Assistant:

cmSourceGroup* cmSourceGroup::LookupChild(const char* name) const
{
  // initializing iterators
  std::vector<cmSourceGroup>::const_iterator iter =
    this->Internal->GroupChildren.begin();
  const std::vector<cmSourceGroup>::const_iterator end =
    this->Internal->GroupChildren.end();

  // st
  for (; iter != end; ++iter) {
    std::string sgName = iter->GetName();

    // look if descenened is the one were looking for
    if (sgName == name) {
      return const_cast<cmSourceGroup*>(&(*iter)); // if it so return it
    }
  }

  // if no child with this name was found return NULL
  return CM_NULLPTR;
}